

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath * testing::internal::FilePath::GetCurrentDir(void)

{
  FilePath *in_RDI;
  char **local_1070;
  allocator<char> local_1041;
  string local_1040;
  char *local_1020;
  char *result;
  char cwd [4097];
  
  memset(&result,0,0x1001);
  local_1020 = getcwd((char *)&result,0x1001);
  if (local_1020 == (char *)0x0) {
    local_1070 = (char **)0x189f93;
  }
  else {
    local_1070 = &result;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1040,(char *)local_1070,&local_1041);
  FilePath(in_RDI,&local_1040);
  std::__cxx11::string::~string((string *)&local_1040);
  std::allocator<char>::~allocator(&local_1041);
  return in_RDI;
}

Assistant:

FilePath FilePath::GetCurrentDir() {
#if GTEST_OS_WINDOWS_MOBILE || GTEST_OS_WINDOWS_PHONE || GTEST_OS_WINDOWS_RT
  // Windows CE doesn't have a current directory, so we just return
  // something reasonable.
  return FilePath(kCurrentDirectoryString);
#elif GTEST_OS_WINDOWS
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(_getcwd(cwd, sizeof(cwd)) == NULL ? "" : cwd);
#else
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  char* result = getcwd(cwd, sizeof(cwd));
# if GTEST_OS_NACL
  // getcwd will likely fail in NaCl due to the sandbox, so return something
  // reasonable. The user may have provided a shim implementation for getcwd,
  // however, so fallback only when failure is detected.
  return FilePath(result == NULL ? kCurrentDirectoryString : cwd);
# endif  // GTEST_OS_NACL
  return FilePath(result == NULL ? "" : cwd);
#endif  // GTEST_OS_WINDOWS_MOBILE
}